

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall State::update(State *this)

{
  int *__k;
  _Rb_tree_header *p_Var1;
  pointer pIVar2;
  _Base_ptr p_Var3;
  mapped_type *pmVar4;
  ulong uVar5;
  _Rb_tree_node_base *p_Var6;
  ImGuiIO *pIVar7;
  _Base_ptr p_Var8;
  _Rb_tree_header *p_Var9;
  int iVar10;
  InputEvent *event;
  pointer pIVar11;
  long lVar12;
  double dVar13;
  
  if ((this->clients)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    __k = &this->curIdControl;
    p_Var8 = (this->clients)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var1 = &(this->clients)._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = &p_Var1->_M_header;
    if (p_Var8 != (_Base_ptr)0x0) {
      do {
        if (*__k <= (int)p_Var8[1]._M_color) {
          p_Var3 = p_Var8;
        }
        p_Var8 = (&p_Var8->_M_left)[(int)p_Var8[1]._M_color < *__k];
      } while (p_Var8 != (_Base_ptr)0x0);
    }
    p_Var8 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var3 != p_Var1) && (p_Var8 = p_Var3, *__k < (int)p_Var3[1]._M_color))
    {
      p_Var8 = &p_Var1->_M_header;
    }
    if (((_Rb_tree_header *)p_Var8 == p_Var1) ||
       (dVar13 = ImGui::GetTime(), (double)this->tControlNext_s < dVar13)) {
      p_Var8 = (this->clients)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var3 = &p_Var1->_M_header;
      if (p_Var8 != (_Base_ptr)0x0) {
        do {
          if (*__k <= (int)*(size_t *)(p_Var8 + 1)) {
            p_Var3 = p_Var8;
          }
          p_Var8 = (&p_Var8->_M_left)[(int)*(size_t *)(p_Var8 + 1) < *__k];
        } while (p_Var8 != (_Base_ptr)0x0);
      }
      p_Var9 = p_Var1;
      if (((_Rb_tree_header *)p_Var3 != p_Var1) &&
         (p_Var9 = (_Rb_tree_header *)p_Var3, *__k < (int)((_Rb_tree_header *)p_Var3)->_M_node_count
         )) {
        p_Var9 = p_Var1;
      }
      if (p_Var9 != p_Var1) {
        pmVar4 = std::
                 map<int,_State::ClientData,_std::less<int>,_std::allocator<std::pair<const_int,_State::ClientData>_>_>
                 ::operator[](&this->clients,__k);
        pmVar4->hasControl = false;
      }
      uVar5 = (long)this->controlIteration + 1;
      this->controlIteration = (int)uVar5;
      p_Var6 = (this->clients)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      iVar10 = (int)(uVar5 % (this->clients)._M_t._M_impl.super__Rb_tree_header._M_node_count);
      lVar12 = (long)iVar10;
      if (iVar10 < 1) {
        if (iVar10 != 0) {
          do {
            p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var6);
            lVar12 = lVar12 + 1;
          } while (lVar12 != 0);
        }
      }
      else {
        do {
          p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
          lVar12 = lVar12 + -1;
        } while (lVar12 != 0);
      }
      *(undefined1 *)&p_Var6[1]._M_parent = 1;
      this->curIdControl = p_Var6[1]._M_color;
      dVar13 = ImGui::GetTime();
      this->tControlNext_s = (float)((double)this->tControl_s + dVar13);
      pIVar7 = ImGui::GetIO();
      ImGuiIO::ClearInputKeys(pIVar7);
    }
  }
  if ((this->clients)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    this->curIdControl = -1;
  }
  if (0 < this->curIdControl) {
    pIVar7 = ImGui::GetIO();
    if ((this->lastAddText)._M_string_length != 0) {
      ImGuiIO::AddInputCharactersUTF8(pIVar7,(this->lastAddText)._M_dataplus._M_p);
    }
    pIVar11 = (this->inputEvents).
              super__Vector_base<State::InputEvent,_std::allocator<State::InputEvent>_>._M_impl.
              super__Vector_impl_data._M_start;
    pIVar2 = (this->inputEvents).
             super__Vector_base<State::InputEvent,_std::allocator<State::InputEvent>_>._M_impl.
             super__Vector_impl_data._M_finish;
    do {
      if (pIVar11 == pIVar2) {
        pIVar11 = (this->inputEvents).
                  super__Vector_base<State::InputEvent,_std::allocator<State::InputEvent>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((this->inputEvents).
            super__Vector_base<State::InputEvent,_std::allocator<State::InputEvent>_>._M_impl.
            super__Vector_impl_data._M_finish != pIVar11) {
          (this->inputEvents).
          super__Vector_base<State::InputEvent,_std::allocator<State::InputEvent>_>._M_impl.
          super__Vector_impl_data._M_finish = pIVar11;
        }
        std::__cxx11::string::_M_replace
                  ((ulong)&this->lastAddText,0,(char *)(this->lastAddText)._M_string_length,0x196dc4
                  );
        return;
      }
      switch(pIVar11->type) {
      case EKey:
        ImGuiIO::AddKeyEvent(pIVar7,pIVar11->key,pIVar11->isDown);
        break;
      case EMouseButton:
        ImGuiIO::AddMouseButtonEvent(pIVar7,pIVar11->mouseButton,pIVar11->isDown);
      case EMousePos:
        ImGuiIO::AddMousePosEvent(pIVar7,(pIVar11->mousePos).x,(pIVar11->mousePos).y);
        break;
      case EMouseWheel:
        ImGuiIO::AddMouseWheelEvent(pIVar7,pIVar11->mouseWheelX,pIVar11->mouseWheelY);
      }
      pIVar11 = pIVar11 + 1;
    } while( true );
  }
  return;
}

Assistant:

void State::update() {
    if (clients.size() > 0 && (clients.find(curIdControl) == clients.end() || ImGui::GetTime() > tControlNext_s)) {
        if (clients.find(curIdControl) != clients.end()) {
            clients[curIdControl].hasControl = false;
        }
        int k = ++controlIteration % clients.size();
        auto client = clients.begin();
        std::advance(client, k);
        client->second.hasControl = true;
        curIdControl = client->first;
        tControlNext_s = ImGui::GetTime() + tControl_s;
        ImGui::GetIO().ClearInputKeys();
    }

    if (clients.size() == 0) {
        curIdControl = -1;
    }

    if (curIdControl > 0) {
        {
            auto & io = ImGui::GetIO();

            if (lastAddText.size() > 0) {
                io.AddInputCharactersUTF8(lastAddText.c_str());
            }

            for (const auto & event : inputEvents) {
                switch (event.type) {
                    case InputEvent::Type::EKey:
                        {
                            io.AddKeyEvent(event.key, event.isDown);
                        } break;
                    case InputEvent::Type::EMousePos:
                        {
                            io.AddMousePosEvent(event.mousePos.x, event.mousePos.y);
                        } break;
                    case InputEvent::Type::EMouseButton:
                        {
                            io.AddMouseButtonEvent(event.mouseButton, event.isDown);
                            io.AddMousePosEvent(event.mousePos.x, event.mousePos.y);
                        } break;
                    case InputEvent::Type::EMouseWheel:
                        {
                            io.AddMouseWheelEvent(event.mouseWheelX, event.mouseWheelY);
                        } break;
                };
            }
        }

        inputEvents.clear();
        lastAddText = "";
    }
}